

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_poly.c
# Opt level: O3

mpt_metatype * mpt_iterator_poly(char *desc,mpt_array *base)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  mpt_metatype *pmVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  mpt_buffer *pmVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 *puVar14;
  mpt_buffer **ppmVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  coeff_poly coeff [128];
  mpt_buffer *apmStack_848 [2];
  undefined1 local_838 [8];
  undefined1 local_830 [2048];
  
  ppmVar15 = apmStack_848;
  pmVar9 = base->_buf;
  if ((pmVar9 == (mpt_buffer *)0x0) ||
     (lVar3 = (**(code **)(((_mpt_vptr_convertable *)&pmVar9->_vptr)->convert + 0x10))(pmVar9),
     lVar3 != 0)) {
    if (desc == (char *)0x0) {
      iVar11 = 0;
    }
    else {
      puVar14 = local_830;
      uVar12 = 0;
      do {
        uVar1 = mpt_cdouble(puVar14,desc,0);
        if ((int)uVar1 < 1) {
          if (uVar12 == 0) {
            if (pmVar9 != (mpt_buffer *)0x0) {
              (**(code **)(((_mpt_vptr_convertable *)&pmVar9->_vptr)->convert + 8))(pmVar9);
            }
            piVar6 = __errno_location();
            *piVar6 = 0x16;
            return (mpt_metatype *)0x0;
          }
          goto LAB_00109a86;
        }
        desc = desc + uVar1;
        uVar12 = uVar12 + 1;
        puVar14 = puVar14 + 0x10;
      } while (uVar12 != 0x80);
      uVar12 = 0x80;
LAB_00109a86:
      apmStack_848[1] = pmVar9;
      pcVar4 = strchr(desc,0x3a);
      iVar11 = (int)uVar12;
      if (pcVar4 == (char *)0x0) {
        uVar1 = 0;
      }
      else {
        pcVar4 = pcVar4 + 1;
        iVar8 = 1;
        if (1 < iVar11) {
          iVar8 = iVar11;
        }
        uVar13 = (ulong)(iVar8 - 1U);
        uVar10 = 0xffffffff;
        do {
          ppmVar15 = (mpt_buffer **)((long)ppmVar15 + 0x10);
          bVar16 = uVar13 == 0;
          uVar13 = uVar13 - 1;
          uVar1 = iVar8 - 1U;
          if (bVar16) break;
          uVar2 = mpt_cdouble(ppmVar15,pcVar4,0);
          pcVar4 = pcVar4 + uVar2;
          uVar10 = uVar10 + 1;
          uVar1 = uVar10;
        } while (0 < (int)uVar2);
      }
      pmVar9 = apmStack_848[1];
      if ((int)uVar1 < iVar11) {
        lVar3 = (uVar12 & 0xffffffff) - (ulong)uVar1;
        lVar7 = lVar3 + -1;
        auVar17._8_4_ = (int)lVar7;
        auVar17._0_8_ = lVar7;
        auVar17._12_4_ = (int)((ulong)lVar7 >> 0x20);
        uVar12 = 0;
        auVar17 = auVar17 ^ _DAT_0010b900;
        ppmVar15 = apmStack_848 + (ulong)uVar1 * 2;
        do {
          auVar18._8_4_ = (int)uVar12;
          auVar18._0_8_ = uVar12;
          auVar18._12_4_ = (int)(uVar12 >> 0x20);
          auVar18 = (auVar18 | _DAT_0010b8f0) ^ _DAT_0010b900;
          if ((bool)(~(auVar18._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar18._0_4_ ||
                      auVar17._4_4_ < auVar18._4_4_) & 1)) {
            ppmVar15[2] = (mpt_buffer *)0x0;
          }
          if ((auVar18._12_4_ != auVar17._12_4_ || auVar18._8_4_ <= auVar17._8_4_) &&
              auVar18._12_4_ <= auVar17._12_4_) {
            ppmVar15[4] = (mpt_buffer *)0x0;
          }
          uVar12 = uVar12 + 2;
          ppmVar15 = ppmVar15 + 4;
        } while ((lVar3 + 1U & 0xfffffffffffffffe) != uVar12);
      }
    }
    pmVar5 = (mpt_metatype *)malloc((long)iVar11 * 0x10 + 0x40);
    if (pmVar5 != (mpt_metatype *)0x0) {
      pmVar5->_vptr = &mpt_iterator_poly::polyMeta;
      pmVar5[1]._vptr = (_mpt_vptr_metatype *)&mpt_iterator_poly::polyIter;
      *(undefined1 (*) [16])(pmVar5 + 2) = (undefined1  [16])0x0;
      pmVar5[5]._vptr = (_mpt_vptr_metatype *)pmVar9;
      pmVar5[6]._vptr = (_mpt_vptr_metatype *)0x0;
      *(int *)&pmVar5[7]._vptr = iVar11;
      memcpy(pmVar5 + 8,local_838,(long)iVar11 * 0x10);
      return pmVar5;
    }
    if (pmVar9 != (mpt_buffer *)0x0) {
      (**(code **)(((_mpt_vptr_convertable *)&pmVar9->_vptr)->convert + 8))(pmVar9);
    }
  }
  return (mpt_metatype *)0x0;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_poly(const char *desc, const _MPT_ARRAY_TYPE(double) *base)
{
	static const MPT_INTERFACE_VPTR(metatype) polyMeta = {
		{ iterPolyConv },
		iterPolyUnref,
		iterPolyRef,
		iterPolyClone
	};
	static const MPT_INTERFACE_VPTR(iterator) polyIter = {
		iterPolyValue,
		iterPolyAdvance,
		iterPolyReset
	};
	MPT_STRUCT(iteratorPolynom) *data;
	MPT_STRUCT(buffer) *buf;
	struct coeff_poly coeff[128];
	int nc = 0, ns = sizeof(coeff)/sizeof(*coeff);
	
	if ((buf = base->_buf)
	    && !buf->_vptr->addref(buf)) {
		return 0;
	}
	/* polynom coefficients */
	if (desc) {
		do {
			ssize_t len = mpt_cdouble(&coeff[nc].mult, desc, 0);
			
			if (len <= 0) {
				if (!nc) {
					if (buf) {
						buf->_vptr->unref(buf);
					}
					errno = EINVAL;
					return 0;
				}
				break;
			}
			desc += len;
		} while (++nc < ns);
	}
	/* variable shift */
	ns = 0;
	if (nc && (desc = strchr(desc, ':'))) {
		int max = nc - 1;
		++desc;
		while (ns < max) {
			ssize_t len = mpt_cdouble(&coeff[ns].shift, desc, 0);
			
			if (len <= 0) {
				break;
			}
			desc += len;
			++ns;
		}
	}
	for ( ; ns < nc; ++ns) {
		coeff[ns].shift = 0;
	}
	if (!(data = malloc(sizeof(*data) + nc * sizeof(*coeff)))) {
		if (buf) {
			buf->_vptr->unref(buf);
		}
		return 0;
	}
	data->_mt._vptr = &polyMeta;
	data->_it._vptr = &polyIter;
	
	MPT_value_set(&data->val, 0, 0);
	
	data->grid._buf = buf;
	data->pos = 0;
	data->coeff = nc;
	memcpy(data + 1, coeff, nc * sizeof(*coeff));
	
	return &data->_mt;
}